

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_cbor_parser<jsoncons::stream_source<unsigned_char>>
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          stream_source<unsigned_char> *source,cbor_decode_options *options,allocator<char> *alloc)

{
  int local_38 [2];
  
  *(undefined ***)this = &PTR__basic_cbor_parser_0099a658;
  *(undefined2 *)(this + 8) = 1;
  this[10] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0xc) = 0;
  *(undefined8 *)(this + 0x14) = 0;
  stream_source<unsigned_char>::stream_source((stream_source<unsigned_char> *)(this + 0x30),source);
  *(undefined4 *)(this + 0x1d8) =
       *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_cbor_decode_options[-3]);
  *(undefined8 *)(this + 0x1c8) = 0x999f30;
  *(undefined8 *)(this + 0x1d0) = 0x999f58;
  *(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> **)(this + 0x1e0)
       = this + 0x1f0;
  *(undefined8 *)(this + 0x1e8) = 0;
  this[0x1f0] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  *(undefined8 *)(this + 0x200) = 0;
  *(undefined8 *)(this + 0x208) = 0;
  *(undefined8 *)(this + 0x210) = 0;
  *(undefined8 *)(this + 0x218) = 0;
  *(undefined8 *)(this + 0x220) = 0;
  *(undefined8 *)(this + 0x228) = 0;
  *(undefined8 *)(this + 0x230) = 0;
  *(undefined8 *)(this + 0x238) = 0;
  *(undefined8 *)(this + 0x240) = 0;
  *(undefined8 *)(this + 0x248) = 0;
  *(undefined8 *)(this + 0x250) = 0;
  *(undefined8 *)(this + 600) = 0;
  *(undefined8 *)(this + 0x260) = 0;
  *(undefined8 *)(this + 0x268) = 0;
  *(undefined8 *)(this + 0x270) = 0;
  local_38[1] = 0;
  local_38[0] = 0;
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>
            ((vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>> *)
             (this + 0x218),(parse_mode *)(local_38 + 1),local_38);
  return;
}

Assistant:

basic_cbor_parser(Sourceable&& source,
                      const cbor_decode_options& options = cbor_decode_options(),
                      const Allocator& alloc = Allocator())
       : alloc_(alloc),
         source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc),
         typed_array_(alloc),
         stringref_map_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }